

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

void __thiscall gui::TextBox::draw(TextBox *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  element_type *peVar2;
  String *in_RSI;
  Widget *in_RDI;
  RenderStates *in_stack_00000020;
  Drawable *in_stack_00000028;
  RenderTarget *in_stack_00000030;
  Vector2f *in_stack_ffffffffffffff48;
  Text *in_stack_ffffffffffffff50;
  Color *in_stack_ffffffffffffff58;
  Transformable *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float x;
  undefined1 local_30 [32];
  String *local_10;
  
  local_10 = in_RSI;
  bVar1 = Widget::isVisible(in_RDI);
  if (bVar1) {
    Widget::getTransform((Widget *)0x1da3a9);
    sf::operator*=((Transform *)in_stack_ffffffffffffff50,(Transform *)in_stack_ffffffffffffff48);
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1da3cb);
    sf::RectangleShape::setSize
              ((RectangleShape *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1da3f4);
    if (((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) {
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da43d);
    }
    else {
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da41f);
    }
    sf::Shape::setFillColor((Shape *)in_stack_ffffffffffffff50,(Color *)in_stack_ffffffffffffff48);
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1da475);
    sf::RenderTarget::draw(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    bVar1 = sf::String::isEmpty((String *)0x1da49c);
    if (((!bVar1) || (bVar1 = sf::String::isEmpty((String *)0x1da4b6), bVar1)) ||
       ((bVar1 = Widget::isFocused(in_RDI), bVar1 &&
        (((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0)))) {
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da5c4);
      sf::Text::setString(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da5f0);
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da60c);
      sf::Text::setFillColor
                ((Text *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
    }
    else {
      peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1da4f1);
      sf::String::substring(local_10,(size_t)local_30,(size_t)&peVar2->text_);
      sf::Text::setString(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
      sf::String::~String((String *)0x1da54a);
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da55b);
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da577);
      sf::Text::setFillColor
                ((Text *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
    }
    if (((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) != 0) {
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da63f);
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da65b);
      sf::Text::setFillColor
                ((Text *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
    }
    peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1da680);
    this_00 = &(peVar2->text_).super_Transformable;
    peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1da6a0);
    x = (peVar2->textPadding_).x;
    peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1da6bf);
    sf::Transformable::setPosition(this_00,x,(peVar2->textPadding_).y);
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1da6f5);
    sf::RenderTarget::draw(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    bVar1 = Widget::isFocused(in_RDI);
    if ((bVar1) && (((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0)) {
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da73d);
      sf::Transformable::setPosition
                ((Transformable *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1da77a);
      sf::RenderTarget::draw(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    }
  }
  return;
}

Assistant:

void TextBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->box_.setSize(size_);
    style_->box_.setFillColor(readOnly_ ? style_->readOnlyBoxColor_ : style_->boxColor_);
    target.draw(style_->box_, states);
    if (boxString_.isEmpty() && !defaultString_.isEmpty() && (!isFocused() || readOnly_)) {
        style_->text_.setString(defaultString_.substring(0, widthCharacters_));
        style_->text_.setFillColor(style_->defaultTextColor_);
    } else {
        style_->text_.setString(visibleString_);
        style_->text_.setFillColor(style_->textColor_);
    }
    if (readOnly_) {
        style_->text_.setFillColor(style_->defaultTextColor_);
    }
    style_->text_.setPosition(style_->textPadding_.x, style_->textPadding_.y);
    target.draw(style_->text_, states);
    if (isFocused() && !readOnly_) {
        style_->caret_.setPosition(caretDrawPosition_);
        target.draw(style_->caret_, states);
    }
}